

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFAnnotationObjectHelper::getPageContentForAppearance
          (string *__return_storage_ptr__,QPDFAnnotationObjectHelper *this,string *name,int rotate,
          int required_flags,int forbidden_flags)

{
  double dVar1;
  double dVar2;
  Rectangle r;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  QPDFMatrix matrix;
  QPDFMatrix AA;
  Rectangle T;
  QPDFObjectHandle as;
  QPDFObjectHandle matrix_obj;
  QPDFObjectHandle bbox_obj;
  QPDFObjectHandle rect_obj;
  Rectangle bbox;
  undefined1 local_1e8 [32];
  double local_1c8;
  double dStack_1c0;
  undefined1 local_1b8 [32];
  double local_198;
  double dStack_190;
  undefined1 local_188 [48];
  Rectangle local_158;
  undefined1 local_138 [32];
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  string *local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Rectangle local_50;
  
  local_f8 = name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,"/N",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"",(allocator<char> *)(local_188 + 0x30));
  getAppearanceStream((QPDFAnnotationObjectHelper *)local_188,(string *)this,(string *)local_1e8);
  bVar3 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1e8);
  if (!bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1e8);
    return __return_storage_ptr__;
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_1b8,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,"/Rect",(allocator<char> *)local_188);
  QPDFObjectHandle::getKey(&local_108,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,"/N",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"",(allocator<char> *)(local_188 + 0x30));
  getAppearanceStream((QPDFAnnotationObjectHelper *)local_188,(string *)this,(string *)local_1e8);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,"/BBox",(allocator<char> *)local_1b8);
  QPDFObjectHandle::getKey(&local_118,(string *)local_138);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,"/Matrix",(allocator<char> *)local_1b8);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_138 + 0x10),(string *)local_138);
  std::__cxx11::string::~string((string *)local_1e8);
  uVar4 = getFlags(this);
  if ((uVar4 & forbidden_flags) == 0) {
    if ((required_flags & ~uVar4) == 0) {
      bVar3 = QPDFObjectHandle::isRectangle(&local_118);
      if ((bVar3) && (bVar3 = QPDFObjectHandle::isRectangle(&local_108), bVar3)) {
        QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1e8);
        bVar3 = QPDFObjectHandle::isMatrix((QPDFObjectHandle *)(local_138 + 0x10));
        if (bVar3) {
          QPDFObjectHandle::getArrayAsMatrix
                    ((Matrix *)local_188,(QPDFObjectHandle *)(local_138 + 0x10));
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1b8,(Matrix *)local_188);
          local_1c8 = local_198;
          dStack_1c0 = dStack_190;
          local_1e8._16_8_ = local_1b8._16_8_;
          local_1e8._24_8_ = local_1b8._24_8_;
          local_1e8._0_8_ = local_1b8._0_8_;
          local_1e8._8_8_ = local_1b8._8_8_;
        }
        QPDFObjectHandle::getArrayAsRectangle((Rectangle *)local_188,&local_108);
        bVar5 = (byte)((uVar4 & 0x10) >> 4) & rotate != 0;
        if (bVar5 == 1) {
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1b8);
          QPDFMatrix::rotatex90((QPDFMatrix *)local_1b8,rotate);
          QPDFMatrix::concat((QPDFMatrix *)local_1b8,(QPDFMatrix *)local_1e8);
          local_1c8 = local_198;
          dStack_1c0 = dStack_190;
          local_1e8._16_8_ = local_1b8._16_8_;
          local_1e8._24_8_ = local_1b8._24_8_;
          local_1e8._0_8_ = local_1b8._0_8_;
          local_1e8._8_8_ = local_1b8._8_8_;
          dVar1 = (double)local_188._16_8_ - (double)local_188._0_8_;
          dVar2 = (double)local_188._24_8_ - (double)local_188._8_8_;
          if (rotate == 0x5a) {
            local_188._8_8_ = local_188._24_8_;
            local_188._24_8_ = (double)local_188._24_8_ + dVar1;
            local_188._16_8_ = (double)local_188._0_8_ + dVar2;
          }
          else if (rotate == 0xb4) {
            dVar2 = dVar2 + (double)local_188._24_8_;
            local_188._8_8_ = local_188._24_8_;
            local_188._24_4_ = SUB84(dVar2,0);
            local_188._16_8_ = local_188._0_8_;
            local_188._28_4_ = (int)((ulong)dVar2 >> 0x20);
            local_188._0_8_ = (element_type *)((double)local_188._0_8_ - dVar1);
          }
          else if (rotate == 0x10e) {
            local_188._8_8_ = (double)local_188._24_8_ - dVar1;
            local_188._16_8_ = local_188._0_8_;
            local_188._0_8_ = (element_type *)((double)local_188._0_8_ - dVar2);
          }
        }
        QPDFObjectHandle::getArrayAsRectangle(&local_50,&local_118);
        r.lly = local_50.lly;
        r.llx = local_50.llx;
        r.urx = local_50.urx;
        r.ury = local_50.ury;
        QPDFMatrix::transformRectangle((Rectangle *)(local_188 + 0x30),(QPDFMatrix *)local_1e8,r);
        if ((local_158.urx != local_158.llx) || (NAN(local_158.urx) || NAN(local_158.llx))) {
          if ((local_158.ury != local_158.lly) || (NAN(local_158.ury) || NAN(local_158.lly))) {
            QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1b8);
            QPDFMatrix::translate
                      ((QPDFMatrix *)local_1b8,(double)local_188._0_8_,(double)local_188._8_8_);
            QPDFMatrix::scale((QPDFMatrix *)local_1b8,
                              ((double)local_188._16_8_ - (double)local_188._0_8_) /
                              (local_158.urx - local_158.llx),
                              ((double)local_188._24_8_ - (double)local_188._8_8_) /
                              (local_158.ury - local_158.lly));
            QPDFMatrix::translate((QPDFMatrix *)local_1b8,-local_158.llx,-local_158.lly);
            if (bVar5 != 0) {
              QPDFMatrix::rotatex90((QPDFMatrix *)local_1b8,rotate);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"/Subtype",(allocator<char> *)&local_70);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"/Form",(allocator<char> *)&local_90);
            QPDFObjectHandle::newName(&local_f0);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_138,&local_b0,(QPDFObjectHandle *)&local_f0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_b0);
            QPDFMatrix::unparse_abi_cxx11_(&local_90,(QPDFMatrix *)local_1b8);
            std::operator+(&local_70,"q\n",&local_90);
            std::operator+(&local_f0,&local_70," cm\n");
            std::operator+(&local_d0,&local_f0,local_f8);
            std::operator+(&local_b0,&local_d0," Do\n");
            std::operator+(__return_storage_ptr__,&local_b0,"Q\n");
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_90);
            goto LAB_0014dc56;
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1b8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1e8);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1e8);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1e8);
  }
LAB_0014dc56:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFAnnotationObjectHelper::getPageContentForAppearance(
    std::string const& name, int rotate, int required_flags, int forbidden_flags)
{
    if (!getAppearanceStream("/N").isStream()) {
        return "";
    }

    // The appearance matrix computed by this method is the transformation matrix that needs to be
    // in effect when drawing this annotation's appearance stream on the page. The algorithm for
    // computing the appearance matrix described in section 12.5.5 of the ISO-32000 PDF spec is
    // similar but not identical to what we are doing here.

    // When rendering an appearance stream associated with an annotation, there are four relevant
    // components:
    //
    // * The appearance stream's bounding box (/BBox)
    // * The appearance stream's matrix (/Matrix)
    // * The annotation's rectangle (/Rect)
    // * In the case of form fields with the NoRotate flag, the page's rotation

    // When rendering a form xobject in isolation, just drawn with a /Do operator, there is no form
    // field, so page rotation is not relevant, and there is no annotation, so /Rect is not
    // relevant, so only /BBox and /Matrix are relevant. The effect of these are as follows:

    // * /BBox is treated as a clipping region
    // * /Matrix is applied as a transformation prior to rendering the appearance stream.

    // There is no relationship between /BBox and /Matrix in this case.

    // When rendering a form xobject in the context of an annotation, things are a little different.
    // In particular, a matrix is established such that /BBox, when transformed by /Matrix, would
    // fit completely inside of /Rect. /BBox is no longer a clipping region. To illustrate the
    // difference, consider a /Matrix of [2 0 0 2 0 0], which is scaling by a factor of two along
    // both axes. If the appearance stream drew a rectangle equal to /BBox, in the case of the form
    // xobject in isolation, this matrix would cause only the lower-left quadrant of the rectangle
    // to be visible since the scaling would cause the rest of it to fall outside of the clipping
    // region. In the case of the form xobject displayed in the context of an annotation, such a
    // matrix would have no effect at all because it would be applied to the bounding box first, and
    // then when the resulting enclosing quadrilateral was transformed to fit into /Rect, the effect
    // of the scaling would be undone.

    // Our job is to create a transformation matrix that compensates for these differences so that
    // the appearance stream of an annotation can be drawn as a regular form xobject.

    // To do this, we perform the following steps, which overlap significantly with the algorithm
    // in 12.5.5:

    // 1. Transform the four corners of /BBox by applying /Matrix to them, creating an arbitrarily
    //    transformed quadrilateral.

    // 2. Find the minimum upright rectangle that encompasses the resulting quadrilateral. This is
    //    the "transformed appearance box", T.

    // 3. Compute matrix A that maps the lower left and upper right corners of T to the annotation's
    //    /Rect. This can be done by scaling so that the sizes match and translating so that the
    //    scaled T exactly overlaps /Rect.

    // If the annotation's /F flag has bit 4 set, this means that annotation is to be rotated about
    // its upper left corner to counteract any rotation of the page so it remains upright. To
    // achieve this effect, we do the following extra steps:

    // 1. Perform the rotation on /BBox box prior to transforming it with /Matrix (by replacing
    //    matrix with concatenation of matrix onto the rotation)

    // 2. Rotate the destination rectangle by the specified amount

    // 3. Apply the rotation to A as computed above to get the final appearance matrix.

    QPDFObjectHandle rect_obj = oh().getKey("/Rect");
    QPDFObjectHandle as = getAppearanceStream("/N").getDict();
    QPDFObjectHandle bbox_obj = as.getKey("/BBox");
    QPDFObjectHandle matrix_obj = as.getKey("/Matrix");

    int flags = getFlags();
    if (flags & forbidden_flags) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper forbidden flags");
        return "";
    }
    if ((flags & required_flags) != required_flags) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper missing required flags");
        return "";
    }

    if (!(bbox_obj.isRectangle() && rect_obj.isRectangle())) {
        return "";
    }
    QPDFMatrix matrix;
    if (matrix_obj.isMatrix()) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper explicit matrix");
        matrix = QPDFMatrix(matrix_obj.getArrayAsMatrix());
    } else {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper default matrix");
    }
    QPDFObjectHandle::Rectangle rect = rect_obj.getArrayAsRectangle();
    bool do_rotate = (rotate && (flags & an_no_rotate));
    if (do_rotate) {
        // If the annotation flags include the NoRotate bit and the page is rotated, we have to
        // rotate the annotation about its upper left corner by the same amount in the opposite
        // direction so that it will remain upright in absolute coordinates. Since the semantics of
        // /Rotate for a page are to rotate the page, while the effect of rotating using a
        // transformation matrix is to rotate the coordinate system, the opposite directionality is
        // explicit in the code.
        QPDFMatrix mr;
        mr.rotatex90(rotate);
        mr.concat(matrix);
        matrix = mr;
        double rect_w = rect.urx - rect.llx;
        double rect_h = rect.ury - rect.lly;
        switch (rotate) {
        case 90:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 90");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx, rect.ury, rect.llx + rect_h, rect.ury + rect_w);
            break;
        case 180:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 180");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx - rect_w, rect.ury, rect.llx, rect.ury + rect_h);
            break;
        case 270:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 270");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx - rect_h, rect.ury - rect_w, rect.llx, rect.ury);
            break;
        default:
            // ignore
            break;
        }
    }

    // Transform bounding box by matrix to get T
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    QPDFObjectHandle::Rectangle T = matrix.transformRectangle(bbox);
    if ((T.urx == T.llx) || (T.ury == T.lly)) {
        // avoid division by zero
        return "";
    }
    // Compute a matrix to transform the appearance box to the rectangle
    QPDFMatrix AA;
    AA.translate(rect.llx, rect.lly);
    AA.scale((rect.urx - rect.llx) / (T.urx - T.llx), (rect.ury - rect.lly) / (T.ury - T.lly));
    AA.translate(-T.llx, -T.lly);
    if (do_rotate) {
        AA.rotatex90(rotate);
    }

    as.replaceKey("/Subtype", QPDFObjectHandle::newName("/Form"));
    return ("q\n" + AA.unparse() + " cm\n" + name + " Do\n" + "Q\n");
}